

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O3

bool __thiscall neueda::cdrItem::asString(cdrItem *this,string *value)

{
  long lVar1;
  char *pcVar2;
  char tmp [256];
  
  switch(this->mType) {
  case CDR_STRING:
    std::__cxx11::string::_M_assign((string *)value);
    return true;
  case CDR_DOUBLE:
    snprintf(tmp,0x100,"%f",this->mDouble);
    pcVar2 = (char *)value->_M_string_length;
    strlen(tmp);
    std::__cxx11::string::_M_replace((ulong)value,0,pcVar2,(ulong)tmp);
    return true;
  case CDR_INTEGER:
    lVar1 = this->mInteger;
    pcVar2 = "%lld";
    break;
  case CDR_DATETIME:
    snprintf(tmp,0x100,"%04u-%02u-%02u %02u:%02u:%02u.%04u",(ulong)(this->mDateTime).mYear,
             (ulong)(this->mDateTime).mMonth,(ulong)(this->mDateTime).mDay,
             (ulong)(this->mDateTime).mHour,(ulong)(this->mDateTime).mMinute,
             (ulong)(this->mDateTime).mSecond,(ulong)(this->mDateTime).mNanosecond);
    goto LAB_00105901;
  case CDR_ARRAY:
    lVar1 = ((long)(this->mArray).super__Vector_base<neueda::cdr,_std::allocator<neueda::cdr>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mArray).super__Vector_base<neueda::cdr,_std::allocator<neueda::cdr>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    pcVar2 = "<array of %zu>";
    break;
  default:
    return false;
  }
  snprintf(tmp,0x100,pcVar2,lVar1);
LAB_00105901:
  pcVar2 = (char *)value->_M_string_length;
  strlen(tmp);
  std::__cxx11::string::_M_replace((ulong)value,0,pcVar2,(ulong)tmp);
  return true;
}

Assistant:

bool
cdrItem::asString (string& value) const
{
    char tmp[256];
    switch (mType)
    {
    case CDR_STRING:
        value.assign (mString);
        return true;
    case CDR_DOUBLE:
        snprintf (tmp, sizeof tmp, "%f", mDouble);
        value.assign (tmp);
        return true;
    case CDR_INTEGER:
        snprintf (tmp, sizeof tmp, "%lld", (long long)mInteger);
        value.assign (tmp);
        return true;
    case CDR_DATETIME:
        snprintf (tmp,
                  sizeof tmp,
                  "%04u-%02u-%02u %02u:%02u:%02u.%04u",
                  mDateTime.mYear,
                  mDateTime.mMonth,
                  mDateTime.mDay,
                  mDateTime.mHour,
                  mDateTime.mMinute,
                  mDateTime.mSecond,
                  mDateTime.mNanosecond);
        value.assign (tmp);
        return true;
    case CDR_ARRAY:
        snprintf (tmp, sizeof tmp, "<array of %zu>", mArray.size ());
        value.assign (tmp);
        return true;
    default:
        return false;
    }
}